

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solbase.h
# Opt level: O2

SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator=(SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            *this,SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *sol)

{
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  SVar1;
  byte bVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_50;
  
  if ((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != sol) {
    this[200] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 )((byte)this[200] & 0xfe | sol->field_0xd0 & 1);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)this,&sol->_primal);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)(this + 0x18),&sol->_slacks);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              (&local_50,&sol->_objVal,(type *)0x0);
    *(undefined8 *)(this + 0xb0) = local_50.m_backend.data._M_elems._32_8_;
    *(undefined8 *)(this + 0xa0) = local_50.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(this + 0xa8) = local_50.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(this + 0x90) = local_50.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(this + 0x98) = local_50.m_backend.data._M_elems._8_8_;
    *(int *)(this + 0xb8) = local_50.m_backend.exp;
    this[0xbc] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )local_50.m_backend.neg;
    *(undefined8 *)(this + 0xc0) = local_50.m_backend._48_8_;
    bVar2 = sol->field_0xd0 & 2;
    SVar1 = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
             )((byte)this[200] & 0xfd | bVar2);
    this[200] = SVar1;
    if (bVar2 != 0) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)(this + 0x30),&sol->_primalRay);
      SVar1 = this[200];
    }
    this[200] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 )((byte)SVar1 & 0xfb | sol->field_0xd0 & 4);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)(this + 0x48),&sol->_dual);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)(this + 0x60),&sol->_redCost);
    bVar2 = sol->field_0xd0 & 8;
    this[200] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 )((byte)this[200] & 0xf7 | bVar2);
    if (bVar2 != 0) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)(this + 0x78),&sol->_dualFarkas);
    }
  }
  return (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

SolBase<R>& operator=(const SolBase<S>& sol)
   {
      if((SolBase<S>*)this != &sol)
      {

         _isPrimalFeasible = sol._isPrimalFeasible;
         _primal = sol._primal;
         _slacks = sol._slacks;

         _objVal = R(sol._objVal);

         _hasPrimalRay = sol._hasPrimalRay;

         if(_hasPrimalRay)
            _primalRay = sol._primalRay;

         _isDualFeasible = sol._isDualFeasible;
         _dual = sol._dual;
         _redCost = sol._redCost;

         _hasDualFarkas = sol._hasDualFarkas;

         if(_hasDualFarkas)
            _dualFarkas = sol._dualFarkas;
      }

      return *this;
   }